

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus DecodeSpecial3LlSc(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  ushort uVar1;
  uint uVar2;
  DecodeStatus extraout_EAX;
  MCRegisterClass *pMVar3;
  uint Reg;
  
  pMVar3 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  Reg = (uint)*(ushort *)((long)pMVar3->RegsBegin + (ulong)(Insn >> 0xf & 0x3e));
  pMVar3 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  uVar1 = *(ushort *)((long)pMVar3->RegsBegin + (ulong)(Insn >> 0x14 & 0x3e));
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 != 0x55a) {
    uVar2 = MCInst_getOpcode(Inst);
    if (uVar2 != 0x558) goto LAB_0018785a;
  }
  MCOperand_CreateReg0(Inst,Reg);
LAB_0018785a:
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  MCOperand_CreateImm0(Inst,(long)(short)Insn >> 7);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeSpecial3LlSc(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int64_t Offset = SignExtend64((Insn >> 7) & 0x1ff, 9);
	unsigned Rt = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Rt = getReg(Decoder, Mips_GPR32RegClassID, Rt);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	if (MCInst_getOpcode(Inst) == Mips_SC_R6 ||
			MCInst_getOpcode(Inst) == Mips_SCD_R6) {
		MCOperand_CreateReg0(Inst, Rt);
	}

	MCOperand_CreateReg0(Inst, Rt);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}